

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cc
# Opt level: O0

string * __thiscall flow::Signature::to_s_abi_cxx11_(string *__return_storage_ptr__,Signature *this)

{
  bool bVar1;
  char cVar2;
  reference pLVar3;
  const_iterator cStack_48;
  LiteralType t;
  const_iterator __end1;
  const_iterator __begin1;
  vector<flow::LiteralType,_std::allocator<flow::LiteralType>_> *__range1;
  Signature *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(");
  __end1 = std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::begin(&this->args_);
  cStack_48 = std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::end(&this->args_);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb8), bVar1) {
    pLVar3 = __gnu_cxx::
             __normal_iterator<const_flow::LiteralType_*,_std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>_>
             ::operator*(&__end1);
    cVar2 = signatureType(*pLVar3);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
    __gnu_cxx::
    __normal_iterator<const_flow::LiteralType_*,_std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
  cVar2 = signatureType(this->returnType_);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Signature::to_s() const {
  std::string result = name_;
  result += "(";
  for (LiteralType t : args_) result += signatureType(t);
  result += ")";
  result += signatureType(returnType_);
  return result;
}